

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerBase.h
# Opt level: O0

void __thiscall RayTracerBase::RayTracerBase(RayTracerBase *this,RayTracerConfig *config)

{
  int iVar1;
  RayTracerConfig *config_local;
  RayTracerBase *this_local;
  
  RayTracerConfig::RayTracerConfig(&this->config,config);
  iVar1 = (config->super_BaseConfig).antiAliasing;
  DynamicArray2D<RGB>::DynamicArray2D
            (&this->bitmap,(long)((config->super_BaseConfig).imageY * iVar1),
             (long)((config->super_BaseConfig).imageZ * iVar1));
  return;
}

Assistant:

RayTracerBase(RayTracerConfig const& config)
    : config(config)
    , bitmap(config.imageY * config.antiAliasing, config.imageZ * config.antiAliasing)
  {
  }